

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpt.c
# Opt level: O0

uint jpt_read_VBAS_info(opj_cio_t *cio,uint value)

{
  uint uVar1;
  uint in_ESI;
  uchar elmt;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  byte bVar3;
  
  uVar1 = cio_read((opj_cio_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec
                  );
  uVar2 = CONCAT13((char)uVar1,(int3)in_stack_fffffffffffffff0);
  while (bVar3 = (byte)((uint)uVar2 >> 0x18), (int)(uint)bVar3 >> 7 == 1) {
    in_ESI = bVar3 & 0x7f | in_ESI << 7;
    uVar1 = cio_read((opj_cio_t *)CONCAT44(in_ESI,uVar2),in_stack_ffffffffffffffec);
    uVar2 = CONCAT13((char)uVar1,(int3)uVar2);
  }
  return bVar3 & 0x7f | in_ESI << 7;
}

Assistant:

unsigned int jpt_read_VBAS_info(opj_cio_t *cio, unsigned int value) {
	unsigned char elmt;

	elmt = cio_read(cio, 1);
	while ((elmt >> 7) == 1) {
		value = (value << 7);
		value |= (elmt & 0x7f);
		elmt = cio_read(cio, 1);
	}
	value = (value << 7);
	value |= (elmt & 0x7f);

	return value;
}